

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O3

void __thiscall Gluco::Solver::removeSatisfied(Solver *this,vec<unsigned_int> *cs)

{
  uint cr;
  int iVar1;
  uint *puVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  char *__function;
  int iVar6;
  char *__file;
  char *__assertion;
  long lVar7;
  
  if (cs->sz < 1) {
    if (cs->sz < 0) goto LAB_005c3044;
  }
  else {
    lVar7 = 0;
    iVar6 = 0;
    do {
      puVar2 = cs->data;
      cr = puVar2[lVar7];
      if ((this->ca).super_RegionAllocator<unsigned_int>.sz <= cr) {
        __assertion = "r >= 0 && r < sz";
        __file = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Alloc.h"
        ;
        __function = "T &Gluco::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]";
        goto LAB_005c303a;
      }
      bVar3 = satisfied(this,(Clause *)((this->ca).super_RegionAllocator<unsigned_int>.memory + cr))
      ;
      if (bVar3) {
        removeClause(this,cr);
      }
      else {
        lVar4 = (long)iVar6;
        iVar6 = iVar6 + 1;
        puVar2[lVar4] = cr;
      }
      lVar7 = lVar7 + 1;
      iVar1 = cs->sz;
    } while (lVar7 < iVar1);
    iVar5 = (int)lVar7 - iVar6;
    if (iVar1 < iVar5) {
LAB_005c3044:
      __assertion = "nelems <= sz";
      __file = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Vec.h";
      __function = "void Gluco::vec<unsigned int>::shrink(int) [T = unsigned int]";
LAB_005c303a:
      __assert_fail(__assertion,__file,0x42,__function);
    }
    if (0 < iVar5) {
      cs->sz = (iVar6 + iVar1) - (int)lVar7;
    }
  }
  return;
}

Assistant:

void Solver::removeSatisfied(vec<CRef>& cs)
{
    int i, j;
    for (i = j = 0; i < cs.size(); i++){
        Clause& c = ca[cs[i]];
        if (satisfied(c)) 
            removeClause(cs[i]);
        else
            cs[j++] = cs[i];
    }
    cs.shrink(i - j);
}